

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

uint64_t calc_amplification_limit_allowance(quicly_conn_t *conn)

{
  ulong uVar1;
  uint64_t budget;
  quicly_conn_t *conn_local;
  uint64_t local_8;
  
  if (((uint)(conn->super).remote.address_validation & 1) == 0) {
    uVar1 = (conn->super).stats.num_bytes.received *
            (ulong)((conn->super).ctx)->pre_validation_amplification_limit;
    if ((conn->super).stats.num_bytes.sent < uVar1) {
      local_8 = uVar1 - (conn->super).stats.num_bytes.sent;
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

static inline uint64_t calc_amplification_limit_allowance(quicly_conn_t *conn)
{
    if (conn->super.remote.address_validation.validated)
        return UINT64_MAX;
    uint64_t budget = conn->super.stats.num_bytes.received * conn->super.ctx->pre_validation_amplification_limit;
    if (budget <= conn->super.stats.num_bytes.sent)
        return 0;
    return budget - conn->super.stats.num_bytes.sent;
}